

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::ResultBuilder::ResultBuilder
          (ResultBuilder *this,IRunContext *runContext,char *macroName,SourceLineInfo *lineInfo,
          char *capturedExpression,Flags resultDisposition,char *secondArg)

{
  allocator local_ab;
  allocator local_aa;
  allocator local_a9;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  this->m_runContext = runContext;
  std::__cxx11::string::string((string *)&local_48,macroName,&local_a9);
  std::__cxx11::string::string((string *)&local_88,capturedExpression,&local_aa);
  std::__cxx11::string::string((string *)&local_a8,secondArg,&local_ab);
  capturedExpressionWithSecondArgument(&local_68,&local_88,&local_a8);
  AssertionInfo::AssertionInfo
            (&this->m_assertionInfo,&local_48,lineInfo,&local_68,resultDisposition);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_48);
  (this->m_data).reconstructedExpression._M_dataplus._M_p =
       (pointer)&(this->m_data).reconstructedExpression.field_2;
  (this->m_data).reconstructedExpression._M_string_length = 0;
  (this->m_data).reconstructedExpression.field_2._M_local_buf[0] = '\0';
  (this->m_data).message._M_dataplus._M_p = (pointer)&(this->m_data).message.field_2;
  (this->m_data).message._M_string_length = 0;
  (this->m_data).message.field_2._M_local_buf[0] = '\0';
  (this->m_data).resultType = Unknown;
  ExprComponents::ExprComponents(&this->m_exprComponents);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->m_stream);
  this->m_shouldDebugBreak = false;
  this->m_shouldThrow = false;
  return;
}

Assistant:

ResultBuilder::ResultBuilder
        (   IRunContext& runContext,
            char const* macroName,
            SourceLineInfo const& lineInfo,
            char const* capturedExpression,
            ResultDisposition::Flags resultDisposition,
            char const* secondArg )
    :   m_runContext( runContext ),
        m_assertionInfo( macroName, lineInfo, capturedExpressionWithSecondArgument( capturedExpression, secondArg ), resultDisposition ),
        m_shouldDebugBreak( false ),
        m_shouldThrow( false )
    {}